

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_psbt.cpp
# Opt level: O2

void __thiscall Psbt_SetTxOutOnly_Test::TestBody(Psbt_SetTxOutOnly_Test *this)

{
  char *pcVar1;
  AssertionResult gtest_ar_2;
  string local_830;
  AssertHelper local_810;
  Amount amount;
  HDWallet wallet2;
  HDWallet wallet1;
  Psbt psbt2;
  string path2;
  string path1;
  Psbt psbt;
  Address addr1;
  TxOutReference txout_2r;
  TxOut txout_2;
  TxOut txout_1;
  Address addr2;
  KeyData key1;
  KeyData key2;
  
  cfd::Psbt::Psbt(&psbt);
  addr2.type_ = kCfdSuccess;
  key1.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_start._0_4_ = cfd::core::Psbt::GetTxOutCount(&psbt.super_Psbt);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&addr1,"0","psbt.GetTxOutCount()",&addr2.type_,(uint *)&key1);
  if ((undefined1)addr1.type_ == kCfdSuccess) {
    testing::Message::Message((Message *)&addr2);
    if (addr1._8_8_ == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)addr1._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&key1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_psbt.cpp"
               ,0x37b,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&key1,(Message *)&addr2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&key1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&addr2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&addr1.witness_ver_);
  cfd::core::ByteData::ByteData((ByteData *)&addr1,&g_psbt_seed1_abi_cxx11_);
  cfd::core::HDWallet::HDWallet(&wallet1,(ByteData *)&addr1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&addr1);
  cfd::core::ByteData::ByteData((ByteData *)&addr1,&g_psbt_seed2_abi_cxx11_);
  cfd::core::HDWallet::HDWallet(&wallet2,(ByteData *)&addr1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&addr1);
  std::__cxx11::string::string((string *)&path1,"44h/0h/0h/0/2",(allocator *)&addr1);
  std::__cxx11::string::string((string *)&path2,"44h/0h/0h/0/2",(allocator *)&addr1);
  cfd::core::HDWallet::GeneratePubkeyData(&key1,&wallet1,kTestnet,&path1);
  cfd::core::HDWallet::GeneratePubkeyData(&key2,&wallet2,kTestnet,&path2);
  cfd::core::KeyData::GetPubkey((Pubkey *)&addr2,&key1);
  cfd::core::Address::Address(&addr1,kCfdIllegalArgumentError,kVersion0,(Pubkey *)&addr2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&addr2);
  cfd::core::KeyData::GetPubkey((Pubkey *)&psbt2,&key2);
  cfd::core::Address::Address(&addr2,kCfdIllegalArgumentError,kVersion0,(Pubkey *)&psbt2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&psbt2);
  cfd::core::Amount::Amount(&amount,100000000);
  cfd::core::TxOut::TxOut(&txout_1,&amount,&addr1);
  cfd::core::TxOut::TxOut(&txout_2,&amount,&addr2);
  cfd::core::TxOutReference::TxOutReference(&txout_2r,&txout_2);
  cfd::core::Psbt::AddTxOut(&psbt.super_Psbt,&txout_1);
  cfd::core::Psbt::AddTxOut(&psbt.super_Psbt,&txout_2r);
  local_830._M_dataplus._M_p._0_4_ = 2;
  gtest_ar_2._0_4_ = cfd::core::Psbt::GetTxOutCount(&psbt.super_Psbt);
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&psbt2,"2","psbt.GetTxOutCount()",(int *)&local_830,(uint *)&gtest_ar_2);
  if ((char)psbt2.super_Psbt._vptr_Psbt == '\0') {
    testing::Message::Message((Message *)&local_830);
    if (psbt2.super_Psbt.wally_psbt_pointer_ == (void *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *psbt2.super_Psbt.wally_psbt_pointer_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_psbt.cpp"
               ,0x38c,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&local_830);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_830);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&psbt2.super_Psbt.wally_psbt_pointer_);
  cfd::core::Psbt::GetData((ByteData *)&local_830,&psbt.super_Psbt);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&psbt2,(ByteData *)&local_830);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,
             "\"70736274ff01004802000000000200e1f50500000000160014b322bddce633b851ac7370ab454f0b367a0654e500e1f50500000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a55500000000000000\""
             ,"psbt.GetData().GetHex().c_str()",
             "70736274ff01004802000000000200e1f50500000000160014b322bddce633b851ac7370ab454f0b367a0654e500e1f50500000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a55500000000000000"
             ,(char *)CONCAT71(psbt2.super_Psbt._vptr_Psbt._1_7_,(char)psbt2.super_Psbt._vptr_Psbt))
  ;
  std::__cxx11::string::~string((string *)&psbt2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_830);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&psbt2);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_830,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_psbt.cpp"
               ,0x38e,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_830,(Message *)&psbt2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_830);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&psbt2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  cfd::core::Psbt::GetData((ByteData *)&local_830,&psbt.super_Psbt);
  cfd::Psbt::Psbt(&psbt2,(ByteData *)&local_830);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_830);
  cfd::core::Psbt::GetBase64_abi_cxx11_(&local_830,&psbt2.super_Psbt);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,
             "\"cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAAAA=\""
             ,"psbt2.GetBase64().c_str()",
             "cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAAAA="
             ,(char *)CONCAT44(local_830._M_dataplus._M_p._4_4_,local_830._M_dataplus._M_p._0_4_));
  std::__cxx11::string::~string((string *)&local_830);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&local_830);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_810,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_psbt.cpp"
               ,0x390,pcVar1);
    testing::internal::AssertHelper::operator=(&local_810,(Message *)&local_830);
    testing::internal::AssertHelper::~AssertHelper(&local_810);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_830);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  cfd::Psbt::~Psbt(&psbt2);
  cfd::core::AbstractTxOutReference::~AbstractTxOutReference(&txout_2r.super_AbstractTxOutReference)
  ;
  cfd::core::AbstractTxOut::~AbstractTxOut(&txout_2.super_AbstractTxOut);
  cfd::core::AbstractTxOut::~AbstractTxOut(&txout_1.super_AbstractTxOut);
  cfd::core::Address::~Address(&addr2);
  cfd::core::Address::~Address(&addr1);
  cfd::core::KeyData::~KeyData(&key2);
  cfd::core::KeyData::~KeyData(&key1);
  std::__cxx11::string::~string((string *)&path2);
  std::__cxx11::string::~string((string *)&path1);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&wallet2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&wallet1);
  cfd::Psbt::~Psbt(&psbt);
  return;
}

Assistant:

TEST(Psbt, SetTxOutOnly) {
  Psbt psbt;
  EXPECT_EQ(0, psbt.GetTxOutCount());
  
  HDWallet wallet1 = HDWallet(ByteData(g_psbt_seed1));
  HDWallet wallet2 = HDWallet(ByteData(g_psbt_seed2));
  std::string path1 = "44h/0h/0h/0/2";
  std::string path2 = "44h/0h/0h/0/2";
  auto key1 = wallet1.GeneratePubkeyData(NetType::kTestnet, path1);
  auto key2 = wallet2.GeneratePubkeyData(NetType::kTestnet, path2);
  auto addr1 = Address(NetType::kTestnet, WitnessVersion::kVersion0, key1.GetPubkey());
  auto addr2 = Address(NetType::kTestnet, WitnessVersion::kVersion0, key2.GetPubkey());

  Amount amount(100000000);
  TxOut txout_1(amount, addr1);
  TxOut txout_2(amount, addr2);
  TxOutReference txout_2r(txout_2);
  psbt.AddTxOut(txout_1);
  psbt.AddTxOut(txout_2r);
  EXPECT_EQ(2, psbt.GetTxOutCount());

  EXPECT_STREQ("70736274ff01004802000000000200e1f50500000000160014b322bddce633b851ac7370ab454f0b367a0654e500e1f50500000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a55500000000000000", psbt.GetData().GetHex().c_str());
  Psbt psbt2(psbt.GetData());
  EXPECT_STREQ("cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAAAA=", psbt2.GetBase64().c_str());
}